

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O0

sftp_request * fxp_mkdir_send(char *path,fxp_attrs *attrs)

{
  fxp_attrs attrs_00;
  BinarySink *bs;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  unsigned_long local_30;
  sftp_packet *local_28;
  sftp_packet *pktout;
  sftp_request *req;
  fxp_attrs *attrs_local;
  char *path_local;
  
  req = (sftp_request *)attrs;
  attrs_local = (fxp_attrs *)path;
  pktout = (sftp_packet *)sftp_alloc_request();
  local_28 = sftp_pkt_init(0xe);
  BinarySink_put_uint32(local_28->binarysink_,(ulong)*(uint *)&pktout->data);
  BinarySink_put_stringz(local_28->binarysink_,(char *)attrs_local);
  bs = local_28->binarysink_;
  if (req == (sftp_request *)0x0) {
    memcpy(&local_60,&no_attrs,0x38);
  }
  else {
    memcpy(&local_60,req,0x38);
  }
  attrs_00.size = uStack_58;
  attrs_00.flags = local_60;
  attrs_00.uid = local_50;
  attrs_00.gid = uStack_48;
  attrs_00.permissions = local_40;
  attrs_00.atime = uStack_38;
  attrs_00.mtime = local_30;
  BinarySink_put_fxp_attrs(bs,attrs_00);
  sftp_send(local_28);
  return (sftp_request *)pktout;
}

Assistant:

struct sftp_request *fxp_mkdir_send(const char *path,
                                    const struct fxp_attrs *attrs)
{
    struct sftp_request *req = sftp_alloc_request();
    struct sftp_packet *pktout;

    pktout = sftp_pkt_init(SSH_FXP_MKDIR);
    put_uint32(pktout, req->id);
    put_stringz(pktout, path);
    put_fxp_attrs(pktout, attrs ? *attrs : no_attrs);
    sftp_send(pktout);

    return req;
}